

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

double double_conversion::StrtodTrimmed(Vector<const_char> trimmed,int exponent)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  double *in_R8;
  uint64_t d64;
  double dVar5;
  DiyFp diy_fp;
  Vector<const_char> buffer;
  Vector<const_char> trimmed_00;
  double guess;
  double local_30;
  
  trimmed_00._12_4_ = in_register_00000014;
  trimmed_00.length_ = exponent;
  trimmed_00.start_ = trimmed._8_8_;
  buffer.start_ = (double_conversion *)trimmed.start_;
  bVar1 = ComputeGuess(buffer.start_,trimmed_00,(int)&local_30,in_R8);
  dVar5 = local_30;
  if (!bVar1) {
    uVar3 = (long)local_30 * 2 & 0x1ffffffffffffe;
    bVar1 = ((ulong)local_30 & 0x7ff0000000000000) == 0;
    uVar4 = uVar3 + 0x20000000000000;
    if (bVar1) {
      uVar4 = uVar3;
    }
    uVar3 = 0xfffffbcd;
    if (!bVar1) {
      uVar3 = (ulong)(((uint)((ulong)local_30 >> 0x34) & 0x7ff) - 0x434);
    }
    diy_fp.f_ = uVar4 + 1;
    buffer._8_8_ = (ulong)trimmed_00.start_ & 0xffffffff;
    diy_fp._8_8_ = uVar3;
    iVar2 = CompareBufferWithDiyFp(buffer,exponent,diy_fp);
    if ((-1 < iVar2) && ((iVar2 != 0 || (((ulong)local_30 & 1) != 0)))) {
      if (local_30 == INFINITY) {
        dVar5 = INFINITY;
      }
      else if ((long)local_30 < 0) {
        if ((local_30 != 0.0) || (dVar5 = 0.0, NAN(local_30))) {
          dVar5 = (double)((long)local_30 + -1);
        }
      }
      else {
        dVar5 = (double)((long)local_30 + 1);
      }
    }
  }
  return dVar5;
}

Assistant:

double StrtodTrimmed(Vector<const char> trimmed, int exponent) {
  DOUBLE_CONVERSION_ASSERT(trimmed.length() <= kMaxSignificantDecimalDigits);
  DOUBLE_CONVERSION_ASSERT(AssertTrimmedDigits(trimmed));
  double guess;
  const bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) {
    return guess;
  }
  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}